

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  bool bVar13;
  size_type sVar14;
  reference pvVar15;
  long in_RSI;
  int in_EDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000060;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000090;
  string command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000320;
  undefined2 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeea;
  undefined1 in_stack_fffffffffffffeeb;
  undefined1 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  undefined1 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef1;
  undefined1 in_stack_fffffffffffffef2;
  undefined1 in_stack_fffffffffffffef3;
  undefined1 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  allocator_type *in_stack_ffffffffffffff18;
  char **in_stack_ffffffffffffff20;
  char **in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  string local_60 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  int local_4;
  
  local_4 = 0;
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RSI + (long)in_EDI * 8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x156111);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x15613c);
  sVar14 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(&local_28);
  if (sVar14 < 2) {
    printUsage();
    exit(1);
  }
  pvVar15 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_28,1);
  std::__cxx11::string::string(local_60,(string *)pvVar15);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffef7,
                                   CONCAT16(in_stack_fffffffffffffef6,
                                            CONCAT15(in_stack_fffffffffffffef5,
                                                     CONCAT14(in_stack_fffffffffffffef4,
                                                              CONCAT13(in_stack_fffffffffffffef3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffef2,
                                                  CONCAT11(in_stack_fffffffffffffef1,
                                                           in_stack_fffffffffffffef0))))))),
                          (char *)CONCAT17(in_stack_fffffffffffffeef,
                                           CONCAT16(in_stack_fffffffffffffeee,
                                                    CONCAT15(in_stack_fffffffffffffeed,
                                                             CONCAT14(in_stack_fffffffffffffeec,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffffeeb,
                                                  CONCAT12(in_stack_fffffffffffffeea,
                                                           in_stack_fffffffffffffee8)))))));
  if ((((bool)uVar1) ||
      (uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffef6,
                                                       CONCAT15(in_stack_fffffffffffffef5,
                                                                CONCAT14(in_stack_fffffffffffffef4,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffef3,
                                                  CONCAT12(in_stack_fffffffffffffef2,
                                                           CONCAT11(in_stack_fffffffffffffef1,
                                                                    in_stack_fffffffffffffef0)))))))
                               ,(char *)CONCAT17(in_stack_fffffffffffffeef,
                                                 CONCAT16(in_stack_fffffffffffffeee,
                                                          CONCAT15(in_stack_fffffffffffffeed,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffeec,
                                                  CONCAT13(in_stack_fffffffffffffeeb,
                                                           CONCAT12(in_stack_fffffffffffffeea,
                                                                    in_stack_fffffffffffffee8)))))))
      , (bool)uVar2)) ||
     (uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffef5,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffef4,
                                                  CONCAT13(in_stack_fffffffffffffef3,
                                                           CONCAT12(in_stack_fffffffffffffef2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffef1,
                                                  in_stack_fffffffffffffef0))))))),
                              (char *)CONCAT17(in_stack_fffffffffffffeef,
                                               CONCAT16(in_stack_fffffffffffffeee,
                                                        CONCAT15(in_stack_fffffffffffffeed,
                                                                 CONCAT14(in_stack_fffffffffffffeec,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffffeeb,
                                                  CONCAT12(in_stack_fffffffffffffeea,
                                                           in_stack_fffffffffffffee8))))))),
     (bool)uVar3)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    train(in_stack_00000300);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
  }
  else {
    uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_fffffffffffffef4,
                                                  CONCAT13(in_stack_fffffffffffffef3,
                                                           CONCAT12(in_stack_fffffffffffffef2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffef1,
                                                  in_stack_fffffffffffffef0))))))),
                            (char *)CONCAT17(in_stack_fffffffffffffeef,
                                             CONCAT16(in_stack_fffffffffffffeee,
                                                      CONCAT15(in_stack_fffffffffffffeed,
                                                               CONCAT14(in_stack_fffffffffffffeec,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffeeb,
                                                  CONCAT12(in_stack_fffffffffffffeea,
                                                           in_stack_fffffffffffffee8)))))));
    if (((bool)uVar4) ||
       (uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(in_stack_fffffffffffffef3,
                                                           CONCAT12(in_stack_fffffffffffffef2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffef1,
                                                  in_stack_fffffffffffffef0))))))),
                                (char *)CONCAT17(in_stack_fffffffffffffeef,
                                                 CONCAT16(in_stack_fffffffffffffeee,
                                                          CONCAT15(in_stack_fffffffffffffeed,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffeec,
                                                  CONCAT13(in_stack_fffffffffffffeeb,
                                                           CONCAT12(in_stack_fffffffffffffeea,
                                                                    in_stack_fffffffffffffee8)))))))
       , (bool)uVar5)) {
      test(in_stack_00000320);
    }
    else {
      uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(
                                                  uVar5,CONCAT12(in_stack_fffffffffffffef2,
                                                                 CONCAT11(in_stack_fffffffffffffef1,
                                                                          in_stack_fffffffffffffef0)
                                                                )))))),
                              (char *)CONCAT17(in_stack_fffffffffffffeef,
                                               CONCAT16(in_stack_fffffffffffffeee,
                                                        CONCAT15(in_stack_fffffffffffffeed,
                                                                 CONCAT14(in_stack_fffffffffffffeec,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffffeeb,
                                                  CONCAT12(in_stack_fffffffffffffeea,
                                                           in_stack_fffffffffffffee8)))))));
      if ((bool)uVar6) {
        quantize(in_stack_00000090);
      }
      else {
        uVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(
                                                  in_stack_fffffffffffffef1,
                                                  in_stack_fffffffffffffef0))))))),
                                (char *)CONCAT17(in_stack_fffffffffffffeef,
                                                 CONCAT16(in_stack_fffffffffffffeee,
                                                          CONCAT15(in_stack_fffffffffffffeed,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffeec,
                                                  CONCAT13(in_stack_fffffffffffffeeb,
                                                           CONCAT12(in_stack_fffffffffffffeea,
                                                                    in_stack_fffffffffffffee8)))))))
        ;
        if ((bool)uVar7) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          printWordVectors(unaff_retaddr);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this);
        }
        else {
          uVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7,
                                                  in_stack_fffffffffffffef0))))))),
                                  (char *)CONCAT17(in_stack_fffffffffffffeef,
                                                   CONCAT16(in_stack_fffffffffffffeee,
                                                            CONCAT15(in_stack_fffffffffffffeed,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffeec,
                                                  CONCAT13(in_stack_fffffffffffffeeb,
                                                           CONCAT12(in_stack_fffffffffffffeea,
                                                                    in_stack_fffffffffffffee8)))))))
          ;
          if ((bool)uVar8) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
            printSentenceVectors(in_stack_ffffffffffffffc0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(this);
          }
          else {
            uVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7,uVar8
                                                                                        ))))))),
                                    (char *)CONCAT17(in_stack_fffffffffffffeef,
                                                     CONCAT16(in_stack_fffffffffffffeee,
                                                              CONCAT15(in_stack_fffffffffffffeed,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffeec,
                                                  CONCAT13(in_stack_fffffffffffffeeb,
                                                           CONCAT12(in_stack_fffffffffffffeea,
                                                                    in_stack_fffffffffffffee8)))))))
            ;
            if ((bool)uVar9) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
              printNgrams(unaff_retaddr);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(this);
            }
            else {
              uVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  uVar4,CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7
                                                  ,uVar8))))))),
                                       (char *)CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffeee,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffffeed,
                                                  CONCAT14(in_stack_fffffffffffffeec,
                                                           CONCAT13(in_stack_fffffffffffffeeb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffeea,
                                                  in_stack_fffffffffffffee8)))))));
              if ((bool)uVar10) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
                nn(in_stack_00000010);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(this);
              }
              else {
                uVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  uVar4,CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7
                                                  ,uVar8))))))),
                                         (char *)CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(
                                                  in_stack_fffffffffffffeed,
                                                  CONCAT14(in_stack_fffffffffffffeec,
                                                           CONCAT13(in_stack_fffffffffffffeeb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffeea,
                                                  in_stack_fffffffffffffee8)))))));
                if ((bool)uVar11) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
                  analogies(in_stack_00000060);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(this);
                }
                else {
                  uVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  uVar4,CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7
                                                  ,uVar8))))))),
                                           (char *)CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,
                                                  CONCAT14(in_stack_fffffffffffffeec,
                                                           CONCAT13(in_stack_fffffffffffffeeb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffeea,
                                                  in_stack_fffffffffffffee8)))))));
                  if (((bool)uVar12) ||
                     (bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,
                                                  CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(uVar6,
                                                  CONCAT11(uVar7,uVar8))))))),
                                               (char *)CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(
                                                  uVar11,CONCAT14(uVar12,CONCAT13(
                                                  in_stack_fffffffffffffeeb,
                                                  CONCAT12(in_stack_fffffffffffffeea,
                                                           in_stack_fffffffffffffee8))))))), bVar13)
                     ) {
                    predict(in_stack_00000210);
                  }
                  else {
                    bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,
                                                  CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(uVar6,
                                                  CONCAT11(uVar7,uVar8))))))),
                                             (char *)CONCAT17(uVar9,CONCAT16(uVar10,CONCAT15(uVar11,
                                                  CONCAT14(uVar12,CONCAT13(bVar13,CONCAT12(
                                                  in_stack_fffffffffffffeea,
                                                  in_stack_fffffffffffffee8)))))));
                    if (!bVar13) {
                      printUsage();
                      exit(1);
                    }
                    dump(in_stack_000000e0);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_4 = 0;
  std::__cxx11::string::~string(local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  std::vector<std::string> args(argv, argv + argc);
  if (args.size() < 2) {
    printUsage();
    exit(EXIT_FAILURE);
  }
  std::string command(args[1]);
  if (command == "skipgram" || command == "cbow" || command == "supervised") {
    train(args);
  } else if (command == "test" || command == "test-label") {
    test(args);
  } else if (command == "quantize") {
    quantize(args);
  } else if (command == "print-word-vectors") {
    printWordVectors(args);
  } else if (command == "print-sentence-vectors") {
    printSentenceVectors(args);
  } else if (command == "print-ngrams") {
    printNgrams(args);
  } else if (command == "nn") {
    nn(args);
  } else if (command == "analogies") {
    analogies(args);
  } else if (command == "predict" || command == "predict-prob") {
    predict(args);
  } else if (command == "dump") {
    dump(args);
  } else {
    printUsage();
    exit(EXIT_FAILURE);
  }
  return 0;
}